

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  ImVec2 *in_RSI;
  ImGuiStyleVar in_EDI;
  ImVec2 *pvar;
  ImGuiContext *g;
  ImGuiStyleVarInfo *var_info;
  ImGuiStyleMod *v;
  ImVec2 v_00;
  ImGuiStyleMod local_34;
  ImVec2 *local_28;
  ImGuiContext *local_20;
  ImGuiStyleVarInfo *local_18;
  ImVec2 *local_10;
  ImGuiStyleVar local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_18 = GetStyleVarInfo(0);
  if ((local_18->Type == 8) && (local_18->Count == 2)) {
    local_20 = GImGui;
    local_28 = (ImVec2 *)ImGuiStyleVarInfo::GetVarPtr(local_18,&GImGui->Style);
    v = (ImGuiStyleMod *)&local_20->StyleVarStack;
    v_00 = *local_28;
    ImGuiStyleMod::ImGuiStyleMod(&local_34,local_4,v_00);
    ImVector<ImGuiStyleMod>::push_back((ImVector<ImGuiStyleMod> *)v_00,v);
    *local_28 = *local_10;
    return;
  }
  __assert_fail("0 && \"Called PushStyleVar() ImVec2 variant but variable is not a ImVec2!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x9dc,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, const ImVec2& val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 2)
    {
        ImGuiContext& g = *GImGui;
        ImVec2* pvar = (ImVec2*)var_info->GetVarPtr(&g.Style);
        g.StyleVarStack.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() ImVec2 variant but variable is not a ImVec2!");
}